

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SplitterBehavior
               (ImRect *bb,ImGuiID id,ImGuiAxis axis,float *size1,float *size2,float min_size1,
               float min_size2,float hover_extend,float hover_visibility_delay)

{
  ImU32 IVar1;
  float *in_RCX;
  int in_EDX;
  ImGuiID in_ESI;
  ImGuiMouseCursor cursor_type;
  ImVec2 *in_RDI;
  float *in_R8;
  float in_XMM0_Da;
  ImVec2 IVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  ImU32 col;
  float size_2_maximum_delta;
  float size_1_maximum_delta;
  float mouse_delta;
  ImVec2 mouse_delta_2d;
  ImRect bb_render;
  ImRect bb_interact;
  bool held;
  bool hovered;
  bool item_add;
  ImGuiItemFlags item_flags_backup;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff48;
  uint in_stack_ffffffffffffff54;
  uint rounding_corners_flags;
  float rounding;
  float in_stack_ffffffffffffff5c;
  float id_00;
  float in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  float in_stack_ffffffffffffff6c;
  float in_stack_ffffffffffffff70;
  float in_stack_ffffffffffffff74;
  ImRect *in_stack_ffffffffffffff78;
  float local_80;
  ImVec2 in_stack_ffffffffffffff88;
  ImVec2 local_68;
  ImRect local_60;
  byte local_4f;
  byte local_4e;
  undefined1 local_4d;
  ImGuiItemFlags local_4c;
  ImGuiWindow *local_48;
  ImGuiContext *local_40;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float *local_28;
  float *local_20;
  int local_18;
  ImGuiID local_14;
  ImVec2 *local_10;
  bool local_1;
  
  local_40 = GImGui;
  local_48 = GImGui->CurrentWindow;
  local_4c = (local_48->DC).ItemFlags;
  (local_48->DC).ItemFlags = (local_48->DC).ItemFlags | 0x18;
  local_38 = in_XMM3_Da;
  local_34 = in_XMM2_Da;
  local_30 = in_XMM1_Da;
  local_2c = in_XMM0_Da;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_4d = ItemAdd(in_stack_ffffffffffffff78,(ImGuiID)in_stack_ffffffffffffff74,
                     (ImRect *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  (local_48->DC).ItemFlags = local_4c;
  if ((bool)local_4d) {
    local_60.Min = *local_10;
    local_60.Max = local_10[1];
    if (local_18 == 1) {
      ImVec2::ImVec2(&local_68,0.0,local_34);
    }
    else {
      ImVec2::ImVec2(&local_68,local_34,0.0);
    }
    ImRect::Expand(&local_60,&local_68);
    id_00 = (float)((ulong)_local_80 >> 0x20);
    ButtonBehavior((ImRect *)in_stack_ffffffffffffff88,(ImGuiID)id_00,
                   (bool *)in_stack_ffffffffffffff78,
                   (bool *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (ImGuiButtonFlags)in_stack_ffffffffffffff6c);
    id_00 = in_stack_ffffffffffffff5c;
    if (local_40->ActiveId != local_14) {
      SetItemAllowOverlap();
      id_00 = in_stack_ffffffffffffff5c;
    }
    if (((local_4f & 1) != 0) ||
       (((local_40->HoveredId == local_14 && (local_40->HoveredIdPreviousFrame == local_14)) &&
        (local_38 <= local_40->HoveredIdTimer)))) {
      cursor_type = 4;
      if (local_18 == 1) {
        cursor_type = 3;
      }
      SetMouseCursor(cursor_type);
    }
    if ((local_4f & 1) != 0) {
      operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x17a250);
      IVar2 = operator-(in_stack_ffffffffffffff48,(ImVec2 *)0x17a265);
      if (local_18 == 1) {
        id_00 = IVar2.y;
      }
      else {
        local_80 = IVar2.x;
        id_00 = local_80;
      }
      in_stack_ffffffffffffff74 = id_00;
      in_stack_ffffffffffffff70 = ImMax<float>(0.0,*local_20 - local_2c);
      in_stack_ffffffffffffff6c = ImMax<float>(0.0,*local_28 - local_30);
      if (in_stack_ffffffffffffff74 < -in_stack_ffffffffffffff70) {
        in_stack_ffffffffffffff74 = -in_stack_ffffffffffffff70;
      }
      if (in_stack_ffffffffffffff6c < in_stack_ffffffffffffff74) {
        in_stack_ffffffffffffff74 = in_stack_ffffffffffffff6c;
      }
      if ((in_stack_ffffffffffffff74 != 0.0) || (NAN(in_stack_ffffffffffffff74))) {
        *local_20 = in_stack_ffffffffffffff74 + *local_20;
        *local_28 = *local_28 - in_stack_ffffffffffffff74;
        if (local_18 == 0) {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,in_stack_ffffffffffffff74,0.0);
        }
        else {
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff64,0.0,in_stack_ffffffffffffff74);
        }
        ImRect::Translate((ImRect *)&stack0xffffffffffffff88,(ImVec2 *)&stack0xffffffffffffff64);
        MarkItemEdited(local_14);
      }
    }
    if ((local_4f & 1) == 0) {
      rounding_corners_flags = in_stack_ffffffffffffff54 & 0xffffff;
      if ((local_4e & 1) != 0) {
        rounding_corners_flags =
             CONCAT13(local_38 <= local_40->HoveredIdTimer,(int3)in_stack_ffffffffffffff54);
      }
      rounding = 3.78351e-44;
      if ((char)(rounding_corners_flags >> 0x18) != '\0') {
        rounding = 3.92364e-44;
      }
    }
    else {
      rounding = 4.06377e-44;
      rounding_corners_flags = in_stack_ffffffffffffff54;
    }
    IVar1 = GetColorU32((ImGuiCol)in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    ImDrawList::AddRectFilled
              ((ImDrawList *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               (ImVec2 *)CONCAT44(in_stack_ffffffffffffff64,IVar1),(ImU32)id_00,rounding,
               rounding_corners_flags);
    local_1 = (bool)(local_4f & 1);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::SplitterBehavior(const ImRect& bb, ImGuiID id, ImGuiAxis axis, float* size1, float* size2, float min_size1, float min_size2, float hover_extend, float hover_visibility_delay)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const ImGuiItemFlags item_flags_backup = window->DC.ItemFlags;
    window->DC.ItemFlags |= ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus;
    bool item_add = ItemAdd(bb, id);
    window->DC.ItemFlags = item_flags_backup;
    if (!item_add)
        return false;

    bool hovered, held;
    ImRect bb_interact = bb;
    bb_interact.Expand(axis == ImGuiAxis_Y ? ImVec2(0.0f, hover_extend) : ImVec2(hover_extend, 0.0f));
    ButtonBehavior(bb_interact, id, &hovered, &held, ImGuiButtonFlags_FlattenChildren | ImGuiButtonFlags_AllowItemOverlap);
    if (g.ActiveId != id)
        SetItemAllowOverlap();

    if (held || (g.HoveredId == id && g.HoveredIdPreviousFrame == id && g.HoveredIdTimer >= hover_visibility_delay))
        SetMouseCursor(axis == ImGuiAxis_Y ? ImGuiMouseCursor_ResizeNS : ImGuiMouseCursor_ResizeEW);

    ImRect bb_render = bb;
    if (held)
    {
        ImVec2 mouse_delta_2d = g.IO.MousePos - g.ActiveIdClickOffset - bb_interact.Min;
        float mouse_delta = (axis == ImGuiAxis_Y) ? mouse_delta_2d.y : mouse_delta_2d.x;

        // Minimum pane size
        float size_1_maximum_delta = ImMax(0.0f, *size1 - min_size1);
        float size_2_maximum_delta = ImMax(0.0f, *size2 - min_size2);
        if (mouse_delta < -size_1_maximum_delta)
            mouse_delta = -size_1_maximum_delta;
        if (mouse_delta > size_2_maximum_delta)
            mouse_delta = size_2_maximum_delta;

        // Apply resize
        if (mouse_delta != 0.0f)
        {
            if (mouse_delta < 0.0f)
                IM_ASSERT(*size1 + mouse_delta >= min_size1);
            if (mouse_delta > 0.0f)
                IM_ASSERT(*size2 - mouse_delta >= min_size2);
            *size1 += mouse_delta;
            *size2 -= mouse_delta;
            bb_render.Translate((axis == ImGuiAxis_X) ? ImVec2(mouse_delta, 0.0f) : ImVec2(0.0f, mouse_delta));
            MarkItemEdited(id);
        }
    }

    // Render
    const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : (hovered && g.HoveredIdTimer >= hover_visibility_delay) ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
    window->DrawList->AddRectFilled(bb_render.Min, bb_render.Max, col, g.Style.FrameRounding);

    return held;
}